

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

void disas_simd_ext(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *s_00;
  TCGContext_conflict1 *pTVar1;
  uintptr_t o;
  TCGTemp *pTVar2;
  TCGv_i64 tcg_left;
  TCGTemp *pTVar3;
  TCGv_i64 tcg_right;
  uint uVar4;
  uintptr_t o_4;
  uint uVar5;
  int pos;
  uintptr_t o_1;
  uint uVar6;
  uintptr_t o_7;
  int iVar7;
  bool bVar8;
  
  if (((insn & 0xc00000) != 0) || ((insn & 0x40004000) == 0x4000)) {
    unallocated_encoding_aarch64(s);
    return;
  }
  if (s->fp_access_checked == true) {
    __assert_fail("!s->fp_access_checked",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                  ,0x487,"_Bool fp_access_check(DisasContext *)");
  }
  s_00 = s->uc->tcg_ctx;
  s->fp_access_checked = true;
  if (s->fp_excp_el != 0) {
    gen_exception_insn(s,s->pc_curr,1,0x1fe0000a,s->fp_excp_el);
    return;
  }
  uVar5 = insn >> 0xb & 0xf;
  uVar6 = insn >> 0x10 & 0x1f;
  uVar4 = insn >> 5 & 0x1f;
  iVar7 = uVar5 * 8;
  pTVar2 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
  tcg_left = (TCGv_i64)((long)pTVar2 - (long)s_00);
  pTVar3 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
  tcg_right = (TCGv_i64)((long)pTVar3 - (long)s_00);
  if ((insn >> 0x1e & 1) == 0) {
    pTVar1 = s->uc->tcg_ctx;
    tcg_gen_op3_aarch64(pTVar1,INDEX_op_ld_i64,(TCGArg)((long)pTVar1 + (long)tcg_right),
                        (TCGArg)(pTVar1->cpu_env + (long)pTVar1),(ulong)(uVar4 * 0x100 + 0xc10));
    if (uVar5 != 0) {
      pTVar1 = s->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar1,INDEX_op_ld_i64,(TCGArg)((long)pTVar1 + (long)tcg_left),
                          (TCGArg)(pTVar1->cpu_env + (long)pTVar1),(ulong)(uVar6 * 0x100 + 0xc10));
      do_ext64(s,tcg_left,tcg_right,iVar7);
    }
    tcg_gen_op2_aarch64(s_00,INDEX_op_movi_i64,(TCGArg)pTVar2,0);
  }
  else {
    bVar8 = uVar5 < 8;
    pos = iVar7 + -0x40;
    if (bVar8) {
      pos = iVar7;
    }
    uVar5 = uVar6;
    if (bVar8) {
      uVar5 = uVar4;
    }
    pTVar1 = s->uc->tcg_ctx;
    tcg_gen_op3_aarch64(pTVar1,INDEX_op_ld_i64,(TCGArg)((long)pTVar1 + (long)tcg_right),
                        (TCGArg)(pTVar1->cpu_env + (long)pTVar1),
                        (ulong)(uVar4 * 0x100 + (uint)!bVar8 * 8 + 0xc10));
    pTVar1 = s->uc->tcg_ctx;
    tcg_gen_op3_aarch64(pTVar1,INDEX_op_ld_i64,(TCGArg)((long)pTVar1 + (long)tcg_left),
                        (TCGArg)(pTVar1->cpu_env + (long)pTVar1),
                        (ulong)(uVar5 * 0x100 + (uint)bVar8 * 8 + 0xc10));
    if (pos != 0) {
      do_ext64(s,tcg_left,tcg_right,pos);
      pTVar2 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      pTVar1 = s->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar1,INDEX_op_ld_i64,
                          (TCGArg)((long)pTVar1 + ((long)pTVar2 - (long)s_00)),
                          (TCGArg)(pTVar1->cpu_env + (long)pTVar1),
                          (ulong)(uVar6 * 0x100 + (uint)!bVar8 * 8 + 0xc10));
      do_ext64(s,(TCGv_i64)((long)pTVar2 - (long)s_00),tcg_left,pos);
      tcg_temp_free_internal_aarch64(s_00,pTVar2);
    }
  }
  pTVar1 = s->uc->tcg_ctx;
  iVar7 = (insn & 0x1f) * 0x100;
  tcg_gen_op3_aarch64(pTVar1,INDEX_op_st_i64,(TCGArg)((long)pTVar1 + (long)tcg_right),
                      (TCGArg)(pTVar1->cpu_env + (long)pTVar1),(ulong)(iVar7 + 0xc10));
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(tcg_right + (long)s_00));
  pTVar1 = s->uc->tcg_ctx;
  tcg_gen_op3_aarch64(pTVar1,INDEX_op_st_i64,(TCGArg)((long)pTVar1 + (long)tcg_left),
                      (TCGArg)(pTVar1->cpu_env + (long)pTVar1),(ulong)(iVar7 + 0xc18));
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(tcg_left + (long)s_00));
  clear_vec_high(s,true,insn & 0x1f);
  return;
}

Assistant:

static void disas_simd_ext(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int is_q = extract32(insn, 30, 1);
    int op2 = extract32(insn, 22, 2);
    int imm4 = extract32(insn, 11, 4);
    int rm = extract32(insn, 16, 5);
    int rn = extract32(insn, 5, 5);
    int rd = extract32(insn, 0, 5);
    int pos = imm4 << 3;
    TCGv_i64 tcg_resl, tcg_resh;

    if (op2 != 0 || (!is_q && extract32(imm4, 3, 1))) {
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    tcg_resh = tcg_temp_new_i64(tcg_ctx);
    tcg_resl = tcg_temp_new_i64(tcg_ctx);

    /* Vd gets bits starting at pos bits into Vm:Vn. This is
     * either extracting 128 bits from a 128:128 concatenation, or
     * extracting 64 bits from a 64:64 concatenation.
     */
    if (!is_q) {
        read_vec_element(s, tcg_resl, rn, 0, MO_64);
        if (pos != 0) {
            read_vec_element(s, tcg_resh, rm, 0, MO_64);
            do_ext64(s, tcg_resh, tcg_resl, pos);
        }
        tcg_gen_movi_i64(tcg_ctx, tcg_resh, 0);
    } else {
        TCGv_i64 tcg_hh;
        typedef struct {
            int reg;
            int elt;
        } EltPosns;
        EltPosns eltposns[] = { {rn, 0}, {rn, 1}, {rm, 0}, {rm, 1} };
        EltPosns *elt = eltposns;

        if (pos >= 64) {
            elt++;
            pos -= 64;
        }

        read_vec_element(s, tcg_resl, elt->reg, elt->elt, MO_64);
        elt++;
        read_vec_element(s, tcg_resh, elt->reg, elt->elt, MO_64);
        elt++;
        if (pos != 0) {
            do_ext64(s, tcg_resh, tcg_resl, pos);
            tcg_hh = tcg_temp_new_i64(tcg_ctx);
            read_vec_element(s, tcg_hh, elt->reg, elt->elt, MO_64);
            do_ext64(s, tcg_hh, tcg_resh, pos);
            tcg_temp_free_i64(tcg_ctx, tcg_hh);
        }
    }

    write_vec_element(s, tcg_resl, rd, 0, MO_64);
    tcg_temp_free_i64(tcg_ctx, tcg_resl);
    write_vec_element(s, tcg_resh, rd, 1, MO_64);
    tcg_temp_free_i64(tcg_ctx, tcg_resh);
    clear_vec_high(s, true, rd);
}